

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

string * decode(string *__return_storage_ptr__,string *stringToDecode)

{
  char cVar1;
  int iVar2;
  size_t in_R8;
  string_view encoded_string;
  string_view str;
  string_view jsonString;
  data dStack_38;
  
  if (stringToDecode->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    str._M_str = (stringToDecode->_M_dataplus)._M_p;
    str._M_len = stringToDecode->_M_string_length;
    iVar2 = hasB64Wrapper(str);
    if (iVar2 == 0) {
      cVar1 = *(stringToDecode->_M_dataplus)._M_p;
      if ((cVar1 == '\'') || (cVar1 == '\"')) {
        jsonString._M_str = (char *)stringToDecode->_M_string_length;
        jsonString._M_len = (size_t)&dStack_38;
        helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
        helics::fileops::JsonAsString((string *)__return_storage_ptr__,(json *)&dStack_38);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&dStack_38);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   stringToDecode);
      }
    }
    else {
      if ((stringToDecode->_M_dataplus)._M_p[stringToDecode->_M_string_length - 1] == '\"') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   stringToDecode);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)stringToDecode
                );
      encoded_string._M_str._0_4_ = iVar2;
      encoded_string._M_len = (size_t)(stringToDecode->_M_dataplus)._M_p;
      encoded_string._M_str._4_4_ = 0;
      gmlc::utilities::base64_decode_to_string_abi_cxx11_
                ((string *)__return_storage_ptr__,(utilities *)stringToDecode->_M_string_length,
                 encoded_string,in_R8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string decode(std::string&& stringToDecode)
{
    if (stringToDecode.empty()) {
        return std::string();
    }
    auto offset = hasB64Wrapper(stringToDecode);
    if (offset != 0) {
        if (stringToDecode.back() == '\"') {
            stringToDecode.pop_back();
        }

        stringToDecode.pop_back();
        return gmlc::utilities::base64_decode_to_string(stringToDecode, offset);
    }

    if ((stringToDecode.front() == '"') || (stringToDecode.front() == '\'')) {
        try {
            return helics::fileops::JsonAsString(helics::fileops::loadJsonStr(stringToDecode));
        }
        catch (const nlohmann::json::exception&) {
            return gmlc::utilities::stringOps::removeQuotes(stringToDecode);
        }
    }
    // move is required since you are returning the rvalue and we want to move from the rvalue input
    return std::move(stringToDecode);
}